

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void fmt::v10::detail::adjust_precision(int *precision,int exp10)

{
  format_error *this;
  
  if (*precision <= (int)(exp10 ^ 0x7fffffffU) || exp10 < 1) {
    *precision = *precision + exp10;
    return;
  }
  this = (format_error *)__cxa_allocate_exception(0x10);
  format_error::runtime_error(this,"number is too big");
  __cxa_throw(this,&format_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline FMT_CONSTEXPR20 void adjust_precision(int& precision, int exp10) {
  // Adjust fixed precision by exponent because it is relative to decimal
  // point.
  if (exp10 > 0 && precision > max_value<int>() - exp10)
    FMT_THROW(format_error("number is too big"));
  precision += exp10;
}